

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.cpp
# Opt level: O1

void __thiscall ccd::Json::Value::Value(Value *this,string *value)

{
  pointer pcVar1;
  
  this->m_type = String;
  *(undefined1 **)
   &(this->m_value).
    super__Variant_base<int,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value>_>_>,_std::vector<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>_>
    .
    super__Move_assign_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
    .
    super__Copy_assign_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
    .
    super__Move_ctor_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
    .
    super__Copy_ctor_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
    .
    super__Variant_storage_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
    ._M_u = (undefined1 *)
            ((long)&(this->m_value).
                    super__Variant_base<int,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value>_>_>,_std::vector<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>_>
                    .
                    super__Move_assign_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
                    .
                    super__Copy_assign_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
                    .
                    super__Move_ctor_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
                    .
                    super__Copy_ctor_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
                    .
                    super__Variant_storage_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
            + 0x10);
  pcVar1 = (value->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_value,pcVar1,pcVar1 + value->_M_string_length);
  *(__index_type *)
   ((long)&(this->m_value).
           super__Variant_base<int,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value>_>_>,_std::vector<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>_>
           .
           super__Move_assign_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
           .
           super__Copy_assign_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
           .
           super__Move_ctor_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
           .
           super__Copy_ctor_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
           .
           super__Variant_storage_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
   + 0x30) = '\x03';
  return;
}

Assistant:

Value::Value ( const std::string& value ) : m_type ( Type::String ), m_value ( value ) {}